

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::addTraceHere(Exception *this)

{
  void *unaff_retaddr;
  Exception *this_local;
  
  addTrace(this,unaff_retaddr);
  return;
}

Assistant:

void Exception::addTraceHere() {
#if __GNUC__
  addTrace(__builtin_return_address(0));
#elif _MSC_VER
  addTrace(_ReturnAddress());
#else
  #error "please implement for your compiler"
#endif
}